

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::seekValueCase
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_t sVar9;
  size_type *psVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  CppGenerator *pCVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  string __str_1;
  string __str;
  string __str_3;
  string __str_2;
  string __str_5;
  string __str_4;
  ulong *local_a78;
  uint local_a70;
  undefined4 uStack_a6c;
  ulong local_a68 [2];
  ulong *local_a58;
  uint local_a50;
  undefined4 uStack_a4c;
  ulong local_a48 [2];
  ulong *local_a38;
  long local_a30;
  ulong local_a28;
  undefined8 uStack_a20;
  ulong *local_a18;
  uint local_a10;
  undefined4 uStack_a0c;
  ulong local_a08 [2];
  ulong *local_9f8;
  uint local_9f0;
  undefined4 uStack_9ec;
  ulong local_9e8 [2];
  ulong *local_9d8;
  uint local_9d0;
  undefined4 uStack_9cc;
  ulong local_9c8 [2];
  string *local_9b8;
  ulong *local_9b0;
  long local_9a8;
  ulong local_9a0 [2];
  ulong *local_990;
  long local_988;
  ulong local_980 [2];
  ulong *local_970;
  long local_968;
  ulong local_960 [2];
  ulong *local_950;
  long local_948;
  ulong local_940 [2];
  ulong *local_930;
  long local_928;
  ulong local_920 [2];
  ulong *local_910;
  long local_908;
  ulong local_900;
  long lStack_8f8;
  ulong *local_8f0;
  long local_8e8;
  ulong local_8e0;
  long lStack_8d8;
  ulong *local_8d0;
  long local_8c8;
  ulong local_8c0;
  long lStack_8b8;
  ulong *local_8b0;
  long local_8a8;
  ulong local_8a0;
  long lStack_898;
  ulong *local_890;
  long local_888;
  ulong local_880;
  long lStack_878;
  ulong *local_870;
  long local_868;
  ulong local_860;
  undefined4 uStack_858;
  undefined4 uStack_854;
  ulong *local_850;
  long local_848;
  ulong local_840;
  long lStack_838;
  ulong *local_830;
  long local_828;
  ulong local_820;
  long lStack_818;
  ulong *local_810;
  long local_808;
  ulong local_800;
  long lStack_7f8;
  ulong *local_7f0;
  long local_7e8;
  ulong local_7e0;
  long lStack_7d8;
  ulong *local_7d0;
  long local_7c8;
  ulong local_7c0;
  long lStack_7b8;
  ulong *local_7b0;
  long local_7a8;
  ulong local_7a0;
  long lStack_798;
  ulong *local_790;
  long local_788;
  ulong local_780;
  long lStack_778;
  ulong *local_770;
  long local_768;
  ulong local_760;
  long lStack_758;
  ulong *local_750;
  long local_748;
  ulong local_740;
  long lStack_738;
  ulong *local_730;
  long local_728;
  ulong local_720;
  long lStack_718;
  ulong *local_710;
  uint local_708;
  undefined4 uStack_704;
  ulong local_700 [2];
  ulong *local_6f0;
  uint local_6e8;
  undefined4 uStack_6e4;
  ulong local_6e0 [2];
  ulong *local_6d0;
  long local_6c8;
  ulong local_6c0 [2];
  ulong *local_6b0;
  long local_6a8;
  ulong local_6a0 [2];
  ulong *local_690;
  long local_688;
  ulong local_680 [2];
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 *local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 *local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 *local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 *local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 *local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  ulong *local_3f0;
  long local_3e8;
  ulong local_3e0 [2];
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0 [2];
  string local_3b0;
  string local_390;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar13 = (char)depth;
  local_50[0] = local_40;
  local_9b8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_50,cVar13 * '\x03' + '\f');
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  local_370 = &local_360;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_360 = *plVar7;
    lStack_358 = plVar5[3];
  }
  else {
    local_360 = *plVar7;
    local_370 = (long *)*plVar5;
  }
  local_368 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_370,(ulong)(rel_name->_M_dataplus)._M_p);
  local_350 = &local_340;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_340 = *plVar7;
    lStack_338 = plVar5[3];
  }
  else {
    local_340 = *plVar7;
    local_350 = (long *)*plVar5;
  }
  local_348 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_350);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_900 = *puVar8;
    lStack_8f8 = plVar5[3];
    local_910 = &local_900;
  }
  else {
    local_900 = *puVar8;
    local_910 = (ulong *)*plVar5;
  }
  local_908 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar11 = cVar13 * '\x03' + '\x0f';
  local_690 = local_680;
  std::__cxx11::string::_M_construct((ulong)&local_690,cVar11);
  uVar17 = 0xf;
  if (local_910 != &local_900) {
    uVar17 = local_900;
  }
  if (uVar17 < (ulong)(local_688 + local_908)) {
    uVar17 = 0xf;
    if (local_690 != local_680) {
      uVar17 = local_680[0];
    }
    if (uVar17 < (ulong)(local_688 + local_908)) goto LAB_0027f516;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_690,0,(char *)0x0,(ulong)local_910);
  }
  else {
LAB_0027f516:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_910,(ulong)local_690);
  }
  local_670 = &local_660;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_660 = *puVar1;
    uStack_658 = puVar6[3];
  }
  else {
    local_660 = *puVar1;
    local_670 = (undefined8 *)*puVar6;
  }
  local_668 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_670);
  local_330 = &local_320;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_320 = *plVar7;
    lStack_318 = plVar5[3];
  }
  else {
    local_320 = *plVar7;
    local_330 = (long *)*plVar5;
  }
  local_328 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_330,(ulong)(rel_name->_M_dataplus)._M_p);
  local_310 = &local_300;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_300 = *plVar7;
    lStack_2f8 = plVar5[3];
  }
  else {
    local_300 = *plVar7;
    local_310 = (long *)*plVar5;
  }
  local_308 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_2f0 = &local_2e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2e0 = *plVar7;
    lStack_2d8 = plVar5[3];
  }
  else {
    local_2e0 = *plVar7;
    local_2f0 = (long *)*plVar5;
  }
  local_2e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_2d0 = &local_2c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2c0 = *plVar7;
    lStack_2b8 = plVar5[3];
  }
  else {
    local_2c0 = *plVar7;
    local_2d0 = (long *)*plVar5;
  }
  local_2c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_8e0 = *puVar8;
    lStack_8d8 = plVar5[3];
    local_8f0 = &local_8e0;
  }
  else {
    local_8e0 = *puVar8;
    local_8f0 = (ulong *)*plVar5;
  }
  local_8e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0027f7d7;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0027f7d7;
      }
      if (sVar9 < 10000) goto LAB_0027f7d7;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_0027f7d7:
  local_9d8 = local_9c8;
  std::__cxx11::string::_M_construct((ulong)&local_9d8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_9d8,local_9d0,depth);
  uVar17 = CONCAT44(uStack_9cc,local_9d0) + local_8e8;
  uVar16 = 0xf;
  if (local_8f0 != &local_8e0) {
    uVar16 = local_8e0;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_9d8 != local_9c8) {
      uVar16 = local_9c8[0];
    }
    if (uVar16 < uVar17) goto LAB_0027f85a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9d8,0,(char *)0x0,(ulong)local_8f0);
  }
  else {
LAB_0027f85a:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8f0,(ulong)local_9d8);
  }
  local_650 = &local_640;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_640 = *puVar1;
    uStack_638 = puVar6[3];
  }
  else {
    local_640 = *puVar1;
    local_650 = (undefined8 *)*puVar6;
  }
  local_648 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_650);
  local_2b0 = &local_2a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2a0 = *plVar7;
    lStack_298 = plVar5[3];
  }
  else {
    local_2a0 = *plVar7;
    local_2b0 = (long *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_290 = &local_280;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_280 = *plVar7;
    lStack_278 = plVar5[3];
  }
  else {
    local_280 = *plVar7;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270 = &local_260;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_260 = *plVar7;
    lStack_258 = plVar5[3];
  }
  else {
    local_260 = *plVar7;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_270,(ulong)(attr_name->_M_dataplus)._M_p);
  local_250 = &local_240;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_240 = *plVar7;
    lStack_238 = plVar5[3];
  }
  else {
    local_240 = *plVar7;
    local_250 = (long *)*plVar5;
  }
  local_248 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_8c0 = *puVar8;
    lStack_8b8 = plVar5[3];
    local_8d0 = &local_8c0;
  }
  else {
    local_8c0 = *puVar8;
    local_8d0 = (ulong *)*plVar5;
  }
  local_8c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = cVar13 * '\x03' + '\x12';
  local_930 = local_920;
  std::__cxx11::string::_M_construct((ulong)&local_930,cVar13);
  uVar17 = 0xf;
  if (local_8d0 != &local_8c0) {
    uVar17 = local_8c0;
  }
  if (uVar17 < (ulong)(local_928 + local_8c8)) {
    uVar17 = 0xf;
    if (local_930 != local_920) {
      uVar17 = local_920[0];
    }
    if (uVar17 < (ulong)(local_928 + local_8c8)) goto LAB_0027fb40;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_930,0,(char *)0x0,(ulong)local_8d0);
  }
  else {
LAB_0027fb40:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8d0,(ulong)local_930);
  }
  local_630 = &local_620;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_620 = *puVar1;
    uStack_618 = puVar6[3];
  }
  else {
    local_620 = *puVar1;
    local_630 = (undefined8 *)*puVar6;
  }
  local_628 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_630);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_8a0 = *puVar8;
    lStack_898 = plVar5[3];
    local_8b0 = &local_8a0;
  }
  else {
    local_8a0 = *puVar8;
    local_8b0 = (ulong *)*plVar5;
  }
  local_8a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0027fc7b;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0027fc7b;
      }
      if (sVar9 < 10000) goto LAB_0027fc7b;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_0027fc7b:
  local_a58 = local_a48;
  std::__cxx11::string::_M_construct((ulong)&local_a58,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a58,local_a50,depth);
  uVar17 = CONCAT44(uStack_a4c,local_a50) + local_8a8;
  uVar16 = 0xf;
  if (local_8b0 != &local_8a0) {
    uVar16 = local_8a0;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_a58 != local_a48) {
      uVar16 = local_a48[0];
    }
    if (uVar16 < uVar17) goto LAB_0027fcee;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a58,0,(char *)0x0,(ulong)local_8b0);
  }
  else {
LAB_0027fcee:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b0,(ulong)local_a58);
  }
  local_610 = &local_600;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_600 = *puVar1;
    uStack_5f8 = puVar6[3];
  }
  else {
    local_600 = *puVar1;
    local_610 = (undefined8 *)*puVar6;
  }
  local_608 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_610);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_880 = *puVar8;
    lStack_878 = plVar5[3];
    local_890 = &local_880;
  }
  else {
    local_880 = *puVar8;
    local_890 = (ulong *)*plVar5;
  }
  local_888 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_950 = local_940;
  std::__cxx11::string::_M_construct((ulong)&local_950,cVar11);
  uVar17 = 0xf;
  if (local_890 != &local_880) {
    uVar17 = local_880;
  }
  if (uVar17 < (ulong)(local_948 + local_888)) {
    uVar17 = 0xf;
    if (local_950 != local_940) {
      uVar17 = local_940[0];
    }
    if (uVar17 < (ulong)(local_948 + local_888)) goto LAB_0027fe43;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_950,0,(char *)0x0,(ulong)local_890);
  }
  else {
LAB_0027fe43:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_890,(ulong)local_950);
  }
  local_5f0 = &local_5e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_5e0 = *puVar1;
    uStack_5d8 = puVar6[3];
  }
  else {
    local_5e0 = *puVar1;
    local_5f0 = (undefined8 *)*puVar6;
  }
  local_5e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5f0);
  local_230 = &local_220;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_220 = *plVar7;
    lStack_218 = plVar5[3];
  }
  else {
    local_220 = *plVar7;
    local_230 = (long *)*plVar5;
  }
  local_228 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)(attr_name->_M_dataplus)._M_p);
  local_210 = &local_200;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_200 = *plVar7;
    lStack_1f8 = plVar5[3];
  }
  else {
    local_200 = *plVar7;
    local_210 = (long *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_1f0 = &local_1e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1e0 = *plVar7;
    lStack_1d8 = plVar5[3];
  }
  else {
    local_1e0 = *plVar7;
    local_1f0 = (long *)*plVar5;
  }
  local_1e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_1d0 = &local_1c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1c0 = *plVar7;
    lStack_1b8 = plVar5[3];
  }
  else {
    local_1c0 = *plVar7;
    local_1d0 = (long *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_860 = *puVar8;
    uStack_858 = (undefined4)plVar5[3];
    uStack_854 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_870 = &local_860;
  }
  else {
    local_860 = *puVar8;
    local_870 = (ulong *)*plVar5;
  }
  local_868 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pCVar14 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pCVar14,
             (pointer)((long)&(pCVar14->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_390,pCVar14,&local_70,depth,parallel);
  uVar17 = 0xf;
  if (local_870 != &local_860) {
    uVar17 = local_860;
  }
  if (uVar17 < local_390._M_string_length + local_868) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      uVar15 = local_390.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_390._M_string_length + local_868) goto LAB_00280140;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,(ulong)local_870);
  }
  else {
LAB_00280140:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_870,(ulong)local_390._M_dataplus._M_p);
  }
  local_5d0 = &local_5c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_5c0 = *puVar1;
    uStack_5b8 = puVar6[3];
  }
  else {
    local_5c0 = *puVar1;
    local_5d0 = (undefined8 *)*puVar6;
  }
  local_5c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5d0);
  local_1b0 = &local_1a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_1a0 = *plVar7;
    lStack_198 = plVar5[3];
  }
  else {
    local_1a0 = *plVar7;
    local_1b0 = (long *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_190 = &local_180;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_180 = *plVar7;
    lStack_178 = plVar5[3];
  }
  else {
    local_180 = *plVar7;
    local_190 = (long *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_840 = *puVar8;
    lStack_838 = plVar5[3];
    local_850 = &local_840;
  }
  else {
    local_840 = *puVar8;
    local_850 = (ulong *)*plVar5;
  }
  local_848 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_970 = local_960;
  std::__cxx11::string::_M_construct((ulong)&local_970,cVar13);
  uVar17 = 0xf;
  if (local_850 != &local_840) {
    uVar17 = local_840;
  }
  if (uVar17 < (ulong)(local_968 + local_848)) {
    uVar17 = 0xf;
    if (local_970 != local_960) {
      uVar17 = local_960[0];
    }
    if (uVar17 < (ulong)(local_968 + local_848)) goto LAB_0028035d;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_970,0,(char *)0x0,(ulong)local_850);
  }
  else {
LAB_0028035d:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_850,(ulong)local_970);
  }
  local_5b0 = &local_5a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_5a0 = *puVar1;
    uStack_598 = puVar6[3];
  }
  else {
    local_5a0 = *puVar1;
    local_5b0 = (undefined8 *)*puVar6;
  }
  local_5a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_5b0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_820 = *puVar8;
    lStack_818 = plVar5[3];
    local_830 = &local_820;
  }
  else {
    local_820 = *puVar8;
    local_830 = (ulong *)*plVar5;
  }
  local_828 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00280498;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00280498;
      }
      if (sVar9 < 10000) goto LAB_00280498;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00280498:
  local_a78 = local_a68;
  std::__cxx11::string::_M_construct((ulong)&local_a78,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a78,local_a70,depth);
  uVar17 = CONCAT44(uStack_a6c,local_a70) + local_828;
  uVar16 = 0xf;
  if (local_830 != &local_820) {
    uVar16 = local_820;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_a78 != local_a68) {
      uVar16 = local_a68[0];
    }
    if (uVar16 < uVar17) goto LAB_0028050b;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a78,0,(char *)0x0,(ulong)local_830);
  }
  else {
LAB_0028050b:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_830,(ulong)local_a78);
  }
  local_590 = &local_580;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_580 = *puVar1;
    uStack_578 = puVar6[3];
  }
  else {
    local_580 = *puVar1;
    local_590 = (undefined8 *)*puVar6;
  }
  local_588 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_590);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_800 = *puVar8;
    lStack_7f8 = plVar5[3];
    local_810 = &local_800;
  }
  else {
    local_800 = *puVar8;
    local_810 = (ulong *)*plVar5;
  }
  local_808 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_990 = local_980;
  std::__cxx11::string::_M_construct((ulong)&local_990,cVar11);
  uVar17 = 0xf;
  if (local_810 != &local_800) {
    uVar17 = local_800;
  }
  if (uVar17 < (ulong)(local_988 + local_808)) {
    uVar17 = 0xf;
    if (local_990 != local_980) {
      uVar17 = local_980[0];
    }
    if (uVar17 < (ulong)(local_988 + local_808)) goto LAB_00280660;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_990,0,(char *)0x0,(ulong)local_810);
  }
  else {
LAB_00280660:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_810,(ulong)local_990);
  }
  local_570 = &local_560;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_560 = *puVar1;
    uStack_558 = puVar6[3];
  }
  else {
    local_560 = *puVar1;
    local_570 = (undefined8 *)*puVar6;
  }
  local_568 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_570);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7e0 = *puVar8;
    lStack_7d8 = plVar5[3];
    local_7f0 = &local_7e0;
  }
  else {
    local_7e0 = *puVar8;
    local_7f0 = (ulong *)*plVar5;
  }
  local_7e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_9b0 = local_9a0;
  std::__cxx11::string::_M_construct((ulong)&local_9b0,cVar11);
  uVar17 = 0xf;
  if (local_7f0 != &local_7e0) {
    uVar17 = local_7e0;
  }
  if (uVar17 < (ulong)(local_9a8 + local_7e8)) {
    uVar17 = 0xf;
    if (local_9b0 != local_9a0) {
      uVar17 = local_9a0[0];
    }
    if (uVar17 < (ulong)(local_9a8 + local_7e8)) goto LAB_002807bb;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9b0,0,(char *)0x0,(ulong)local_7f0);
  }
  else {
LAB_002807bb:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_9b0);
  }
  local_550 = &local_540;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_540 = *puVar1;
    uStack_538 = puVar6[3];
  }
  else {
    local_540 = *puVar1;
    local_550 = (undefined8 *)*puVar6;
  }
  local_548 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  pCVar14 = (CppGenerator *)0x2b2c7d;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_550);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7c0 = *puVar8;
    lStack_7b8 = plVar5[3];
    local_7d0 = &local_7c0;
  }
  else {
    local_7c0 = *puVar8;
    local_7d0 = (ulong *)*plVar5;
  }
  local_7c8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  genFindUpperBound(&local_3b0,pCVar14,rel_name,attr_name,depth,parallel);
  uVar17 = 0xf;
  if (local_7d0 != &local_7c0) {
    uVar17 = local_7c0;
  }
  if (uVar17 < local_3b0._M_string_length + local_7c8) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      uVar15 = local_3b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_3b0._M_string_length + local_7c8) goto LAB_00280908;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,(ulong)local_7d0);
  }
  else {
LAB_00280908:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_7d0,(ulong)local_3b0._M_dataplus._M_p);
  }
  local_a38 = &local_a28;
  puVar8 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar8) {
    local_a28 = *puVar8;
    uStack_a20 = puVar6[3];
  }
  else {
    local_a28 = *puVar8;
    local_a38 = (ulong *)*puVar6;
  }
  local_a30 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  local_6b0 = local_6a0;
  std::__cxx11::string::_M_construct((ulong)&local_6b0,cVar13);
  uVar17 = 0xf;
  if (local_a38 != &local_a28) {
    uVar17 = local_a28;
  }
  if (uVar17 < (ulong)(local_6a8 + local_a30)) {
    uVar17 = 0xf;
    if (local_6b0 != local_6a0) {
      uVar17 = local_6a0[0];
    }
    if (uVar17 < (ulong)(local_6a8 + local_a30)) goto LAB_002809e1;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6b0,0,(char *)0x0,(ulong)local_a38);
  }
  else {
LAB_002809e1:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a38,(ulong)local_6b0);
  }
  local_530 = &local_520;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_520 = *puVar1;
    uStack_518 = puVar6[3];
  }
  else {
    local_520 = *puVar1;
    local_530 = (undefined8 *)*puVar6;
  }
  local_528 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_530);
  local_170 = &local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170 = (long *)*plVar5;
  }
  local_168 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)(attr_name->_M_dataplus)._M_p);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_130 = &local_120;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_120 = *plVar7;
    lStack_118 = plVar5[3];
  }
  else {
    local_120 = *plVar7;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(rel_name->_M_dataplus)._M_p);
  local_110 = &local_100;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_100 = *plVar7;
    lStack_f8 = plVar5[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_e0 = *plVar7;
    lStack_d8 = plVar5[3];
  }
  else {
    local_e0 = *plVar7;
    local_f0 = (long *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_d0 = &local_c0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_c0 = *plVar7;
    lStack_b8 = plVar5[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_7a0 = *puVar8;
    lStack_798 = plVar5[3];
    local_7b0 = &local_7a0;
  }
  else {
    local_7a0 = *puVar8;
    local_7b0 = (ulong *)*plVar5;
  }
  local_7a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar12 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar4 = '\x04';
    do {
      cVar12 = cVar4;
      if (sVar9 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00280d62;
      }
      if (sVar9 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00280d62;
      }
      if (sVar9 < 10000) goto LAB_00280d62;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar4 = cVar12 + '\x04';
    } while (bVar2);
    cVar12 = cVar12 + '\x01';
  }
LAB_00280d62:
  local_9f8 = local_9e8;
  std::__cxx11::string::_M_construct((ulong)&local_9f8,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_9f8,local_9f0,depth);
  uVar17 = CONCAT44(uStack_9ec,local_9f0) + local_7a8;
  uVar16 = 0xf;
  if (local_7b0 != &local_7a0) {
    uVar16 = local_7a0;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_9f8 != local_9e8) {
      uVar16 = local_9e8[0];
    }
    if (uVar16 < uVar17) goto LAB_00280de5;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_9f8,0,(char *)0x0,(ulong)local_7b0);
  }
  else {
LAB_00280de5:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b0,(ulong)local_9f8);
  }
  local_510 = &local_500;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_500 = *puVar1;
    uStack_4f8 = puVar6[3];
  }
  else {
    local_500 = *puVar1;
    local_510 = (undefined8 *)*puVar6;
  }
  local_508 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_510);
  local_b0 = &local_a0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar5[3];
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(attr_name->_M_dataplus)._M_p);
  local_90 = &local_80;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_780 = *puVar8;
    lStack_778 = plVar5[3];
    local_790 = &local_780;
  }
  else {
    local_780 = *puVar8;
    local_790 = (ulong *)*plVar5;
  }
  local_788 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_6d0 = local_6c0;
  std::__cxx11::string::_M_construct((ulong)&local_6d0,cVar13);
  uVar17 = 0xf;
  if (local_790 != &local_780) {
    uVar17 = local_780;
  }
  if (uVar17 < (ulong)(local_6c8 + local_788)) {
    uVar17 = 0xf;
    if (local_6d0 != local_6c0) {
      uVar17 = local_6c0[0];
    }
    if (uVar17 < (ulong)(local_6c8 + local_788)) goto LAB_00280ffa;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6d0,0,(char *)0x0,(ulong)local_790);
  }
  else {
LAB_00280ffa:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_790,(ulong)local_6d0);
  }
  local_4f0 = &local_4e0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4e0 = *puVar1;
    uStack_4d8 = puVar6[3];
  }
  else {
    local_4e0 = *puVar1;
    local_4f0 = (undefined8 *)*puVar6;
  }
  local_4e8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_760 = *puVar8;
    lStack_758 = plVar5[3];
    local_770 = &local_760;
  }
  else {
    local_760 = *puVar8;
    local_770 = (ulong *)*plVar5;
  }
  local_768 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00281134;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00281134;
      }
      if (sVar9 < 10000) goto LAB_00281134;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_00281134:
  local_a18 = local_a08;
  std::__cxx11::string::_M_construct((ulong)&local_a18,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a18,local_a10,depth);
  uVar17 = CONCAT44(uStack_a0c,local_a10) + local_768;
  uVar16 = 0xf;
  if (local_770 != &local_760) {
    uVar16 = local_760;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_a18 != local_a08) {
      uVar16 = local_a08[0];
    }
    if (uVar16 < uVar17) goto LAB_002811a9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a18,0,(char *)0x0,(ulong)local_770);
  }
  else {
LAB_002811a9:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_770,(ulong)local_a18);
  }
  local_4d0 = &local_4c0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4c0 = *puVar1;
    uStack_4b8 = puVar6[3];
  }
  else {
    local_4c0 = *puVar1;
    local_4d0 = (undefined8 *)*puVar6;
  }
  local_4c8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_740 = *puVar8;
    lStack_738 = plVar5[3];
    local_750 = &local_740;
  }
  else {
    local_740 = *puVar8;
    local_750 = (ulong *)*plVar5;
  }
  local_748 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_002812e0;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_002812e0;
      }
      if (sVar9 < 10000) goto LAB_002812e0;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_002812e0:
  local_6f0 = local_6e0;
  std::__cxx11::string::_M_construct((ulong)&local_6f0,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_6f0,local_6e8,depth);
  uVar17 = CONCAT44(uStack_6e4,local_6e8) + local_748;
  uVar16 = 0xf;
  if (local_750 != &local_740) {
    uVar16 = local_740;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_6f0 != local_6e0) {
      uVar16 = local_6e0[0];
    }
    if (uVar16 < uVar17) goto LAB_00281363;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_6f0,0,(char *)0x0,(ulong)local_750);
  }
  else {
LAB_00281363:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_750,(ulong)local_6f0);
  }
  local_4b0 = &local_4a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_4a0 = *puVar1;
    uStack_498 = puVar6[3];
  }
  else {
    local_4a0 = *puVar1;
    local_4b0 = (undefined8 *)*puVar6;
  }
  local_4a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b0);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_720 = *puVar8;
    lStack_718 = plVar5[3];
    local_730 = &local_720;
  }
  else {
    local_720 = *puVar8;
    local_730 = (ulong *)*plVar5;
  }
  local_728 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar13 = '\x01';
  if (9 < depth) {
    sVar9 = depth;
    cVar12 = '\x04';
    do {
      cVar13 = cVar12;
      if (sVar9 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0028149e;
      }
      if (sVar9 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0028149e;
      }
      if (sVar9 < 10000) goto LAB_0028149e;
      bVar2 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar12 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_0028149e:
  local_710 = local_700;
  std::__cxx11::string::_M_construct((ulong)&local_710,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_710,local_708,depth);
  uVar17 = CONCAT44(uStack_704,local_708) + local_728;
  uVar16 = 0xf;
  if (local_730 != &local_720) {
    uVar16 = local_720;
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_710 != local_700) {
      uVar16 = local_700[0];
    }
    if (uVar16 < uVar17) goto LAB_00281522;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_710,0,(char *)0x0,(ulong)local_730);
  }
  else {
LAB_00281522:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_730,(ulong)local_710);
  }
  local_490 = &local_480;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_480 = *puVar1;
    uStack_478 = puVar6[3];
  }
  else {
    local_480 = *puVar1;
    local_490 = (undefined8 *)*puVar6;
  }
  local_488 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_490);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_420 = *puVar8;
    lStack_418 = plVar5[3];
    local_430 = &local_420;
  }
  else {
    local_420 = *puVar8;
    local_430 = (ulong *)*plVar5;
  }
  local_428 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct((ulong)&local_3d0,cVar11);
  uVar17 = 0xf;
  if (local_430 != &local_420) {
    uVar17 = local_420;
  }
  if (uVar17 < (ulong)(local_3c8 + local_428)) {
    uVar17 = 0xf;
    if (local_3d0 != local_3c0) {
      uVar17 = local_3c0[0];
    }
    if (uVar17 < (ulong)(local_3c8 + local_428)) goto LAB_00281675;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_430);
  }
  else {
LAB_00281675:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_3d0);
  }
  local_470 = &local_460;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_460 = *puVar1;
    uStack_458 = puVar6[3];
  }
  else {
    local_460 = *puVar1;
    local_470 = (undefined8 *)*puVar6;
  }
  local_468 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_470);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_400 = *puVar8;
    lStack_3f8 = plVar5[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar8;
    local_410 = (ulong *)*plVar5;
  }
  local_408 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3f0 = local_3e0;
  std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar11);
  uVar17 = 0xf;
  if (local_410 != &local_400) {
    uVar17 = local_400;
  }
  if (uVar17 < (ulong)(local_3e8 + local_408)) {
    uVar17 = 0xf;
    if (local_3f0 != local_3e0) {
      uVar17 = local_3e0[0];
    }
    if ((ulong)(local_3e8 + local_408) <= uVar17) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_3f0,0,(char *)0x0,(ulong)local_410);
      goto LAB_002817f0;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_3f0);
LAB_002817f0:
  local_450 = &local_440;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_440 = *puVar1;
    uStack_438 = puVar6[3];
  }
  else {
    local_440 = *puVar1;
    local_450 = (undefined8 *)*puVar6;
  }
  local_448 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_450);
  (local_9b8->_M_dataplus)._M_p = (pointer)&local_9b8->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (local_9b8->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_9b8->field_2 + 8) = lVar3;
  }
  else {
    (local_9b8->_M_dataplus)._M_p = (pointer)*plVar5;
    (local_9b8->field_2)._M_allocated_capacity = *psVar10;
  }
  local_9b8->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490);
  }
  if (local_710 != local_700) {
    operator_delete(local_710);
  }
  if (local_730 != &local_720) {
    operator_delete(local_730);
  }
  if (local_4b0 != &local_4a0) {
    operator_delete(local_4b0);
  }
  if (local_6f0 != local_6e0) {
    operator_delete(local_6f0);
  }
  if (local_750 != &local_740) {
    operator_delete(local_750);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0);
  }
  if (local_a18 != local_a08) {
    operator_delete(local_a18);
  }
  if (local_770 != &local_760) {
    operator_delete(local_770);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0);
  }
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0);
  }
  if (local_790 != &local_780) {
    operator_delete(local_790);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510);
  }
  if (local_9f8 != local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_7b0 != &local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530);
  }
  if (local_6b0 != local_6a0) {
    operator_delete(local_6b0);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if (local_7d0 != &local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_550 != &local_540) {
    operator_delete(local_550);
  }
  if (local_9b0 != local_9a0) {
    operator_delete(local_9b0);
  }
  if (local_7f0 != &local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_570 != &local_560) {
    operator_delete(local_570);
  }
  if (local_990 != local_980) {
    operator_delete(local_990);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810);
  }
  if (local_590 != &local_580) {
    operator_delete(local_590);
  }
  if (local_a78 != local_a68) {
    operator_delete(local_a78);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830);
  }
  if (local_5b0 != &local_5a0) {
    operator_delete(local_5b0);
  }
  if (local_970 != local_960) {
    operator_delete(local_970);
  }
  if (local_850 != &local_840) {
    operator_delete(local_850);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_870 != &local_860) {
    operator_delete(local_870);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0);
  }
  if (local_950 != local_940) {
    operator_delete(local_950);
  }
  if (local_890 != &local_880) {
    operator_delete(local_890);
  }
  if (local_610 != &local_600) {
    operator_delete(local_610);
  }
  if (local_a58 != local_a48) {
    operator_delete(local_a58);
  }
  if (local_8b0 != &local_8a0) {
    operator_delete(local_8b0);
  }
  if (local_630 != &local_620) {
    operator_delete(local_630);
  }
  if (local_930 != local_920) {
    operator_delete(local_930);
  }
  if (local_8d0 != &local_8c0) {
    operator_delete(local_8d0);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_650 != &local_640) {
    operator_delete(local_650);
  }
  if (local_9d8 != local_9c8) {
    operator_delete(local_9d8);
  }
  if (local_8f0 != &local_8e0) {
    operator_delete(local_8f0);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_670 != &local_660) {
    operator_delete(local_670);
  }
  if (local_690 != local_680) {
    operator_delete(local_690);
  }
  if (local_910 != &local_900) {
    operator_delete(local_910);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return local_9b8;
}

Assistant:

std::string CppGenerator::seekValueCase(size_t depth, const std::string& rel_name,
                                        const std::string& attr_name,
                                        bool parallel)
{
    return offset(4+depth)+"case "+rel_name+"_ID:\n"+
        //if
        offset(5+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(6+depth)+"found["+std::to_string(depth)+"] = true;\n"+
        // else if 
        offset(5+depth)+"else if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(6+depth)+"atEnd["+std::to_string(depth)+"] = true;\n"+
        //else 
        offset(5+depth)+"else\n"+offset(5+depth)+"{\n"+
        /* Calling genFindUpperBound Function */
        genFindUpperBound(rel_name,attr_name,depth, parallel)+
        // offset(6+depth)+"findUpperBound("+rel_name+",&"+rel_name+"_tuple::"+
        // attr_name+", max_"+attr_name+",lowerptr_"+rel_name+"["+
        // std::to_string(depth)+"],"+getUpperPointer(rel_name,depth,parallel)+");\n"+
        offset(6+depth)+"max_"+attr_name+" = "+rel_name+"[lowerptr_"+
        rel_name+"["+std::to_string(depth)+"]]."+attr_name+";\n"+
        offset(6+depth)+"rel["+std::to_string(depth)+"] = (rel["+
        std::to_string(depth)+"]+1) % numOfRel["+std::to_string(depth)+"];\n"+
        offset(5+depth)+"}\n"+
        //break
        offset(5+depth)+"break;\n";
}